

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_peace(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  
  for (ch_00 = ch->in_room->people; ch_00 != (CHAR_DATA *)0x0; ch_00 = ch_00->next_in_room) {
    if (ch_00->fighting != (CHAR_DATA *)0x0) {
      stop_fighting(ch_00,true);
    }
    bVar1 = is_npc(ch_00);
    if ((bVar1) && ((ch_00->act[0] & 0x20U) != 0)) {
      ch_00->act[0] = ch_00->act[0] & 0xffffffffffffffdf;
    }
    bVar1 = is_npc(ch_00);
    if (bVar1) {
      ch_00->last_fought = (CHAR_DATA *)0x0;
    }
  }
  send_to_char("Ok.\n\r",ch);
  return;
}

Assistant:

void do_peace(CHAR_DATA *ch, char *argument)
{
	for (CHAR_DATA *rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (rch->fighting != nullptr)
			stop_fighting(rch, true);

		if (is_npc(rch) && IS_SET(rch->act, ACT_AGGRESSIVE))
			REMOVE_BIT(rch->act, ACT_AGGRESSIVE);

		if (is_npc(rch))
			rch->last_fought = nullptr;
	}

	send_to_char("Ok.\n\r", ch);
}